

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O3

void __thiscall pstore::command_line::option::~option(option *this)

{
  _List_node_base *p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_option = (_func_int **)&PTR__option_001315a8;
  all_abi_cxx11_();
  p_Var1 = (this->container_pos_)._M_node;
  all[abi:cxx11]()::all_options_abi_cxx11_.
  super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>.
  _M_impl._M_node._M_size =
       all[abi:cxx11]()::all_options_abi_cxx11_.
       super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
       ._M_impl._M_node._M_size - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var1,0x18);
  pcVar2 = (this->description_)._M_dataplus._M_p;
  paVar3 = &(this->description_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->usage_)._M_dataplus._M_p;
  paVar3 = &(this->usage_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar3 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

option::~option () {
                // Remove this option from the global container.
                options_container & all = option::all ();
                all.erase (container_pos_);
            }